

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O3

int Curl_strcasecompare(char *first,char *second)

{
  bool bVar1;
  byte bVar2;
  byte *pbVar3;
  ulong uVar4;
  
  bVar2 = *first;
  if (bVar2 == 0) {
    bVar1 = true;
  }
  else {
    pbVar3 = (byte *)(first + 1);
    do {
      uVar4 = (ulong)(byte)*second;
      bVar1 = uVar4 != 0;
      if (uVar4 == 0) break;
      if (""[bVar2] != ""[uVar4]) {
        return 0;
      }
      second = (char *)((byte *)second + 1);
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar2 != 0);
  }
  return (int)(byte)(*second != 0U ^ bVar1);
}

Assistant:

int Curl_strcasecompare(const char *first, const char *second)
{
  while(*first && *second) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second))
      /* get out of the loop as soon as they don't match */
      return 0;
    first++;
    second++;
  }
  /* If we're here either the strings are the same or the length is different.
     We can just test if the "current" character is non-zero for one and zero
     for the other. Note that the characters may not be exactly the same even
     if they match, we only want to compare zero-ness. */
  return !*first == !*second;
}